

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.hpp
# Opt level: O2

pair<const_pstore::index::details::index_pointer,_unsigned_long> __thiscall
pstore::index::details::linear_node::
lookup<pstore::uint128,pstore::uint128,std::equal_to<pstore::uint128>,void>
          (linear_node *this,serialize *db,database_reader *key)

{
  database *pdVar1;
  index_pointer iVar2;
  ulong extraout_RDX;
  database_reader *archive;
  long lVar3;
  serialize *this_00;
  linear_node *__range3;
  unsigned_long uVar4;
  pair<const_pstore::index::details::index_pointer,_unsigned_long> pVar5;
  serialize *local_40;
  value_type local_38;
  
  lVar3 = this->size_ << 3;
  uVar4 = 0;
  archive = key;
  this_00 = db;
  do {
    if (lVar3 == 0) {
      iVar2.internal_ = (internal_node *)0x0;
      uVar4 = 0xffffffffffffffff;
LAB_00118265:
      pVar5.second = uVar4;
      pVar5.first.internal_ = iVar2.internal_;
      return pVar5;
    }
    local_38 = this->leaves_[uVar4].a_;
    local_40 = db;
    pdVar1 = (database *)
             serialize::read<pstore::uint128,pstore::serialize::archive::database_reader>
                       ((uint128 *)&local_40,this_00,archive);
    archive = (database_reader *)(extraout_RDX ^ (key->addr_).a_);
    if (pdVar1 == key->db_ && archive == (database_reader *)0x0) {
      iVar2 = (index_pointer)((index_pointer *)(this->leaves_ + uVar4))->internal_;
      goto LAB_00118265;
    }
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + -8;
  } while( true );
}

Assistant:

auto linear_node::lookup (database const & db, OtherKeyType const & key,
                                      KeyEqual equal) const
                -> std::pair<index_pointer const, std::size_t> {
                // Linear search. TODO: perhaps we should sort the nodes and use a binary
                // search? This would require a template compare method.
                std::size_t cnum = 0;
                for (auto const & child : *this) {
                    KeyType const existing_key =
                        serialize::read<KeyType> (serialize::archive::database_reader{db, child});
                    if (equal (existing_key, key)) {
                        return {index_pointer{child}, cnum};
                    }
                    ++cnum;
                }
                // Not found
                return {index_pointer (), details::not_found};
            }